

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# heterogeneous_queue.hpp
# Opt level: O1

void libtorrent::heterogeneous_queue<libtorrent::alert>::move<libtorrent::dht_stats_alert>
               (char *dst,char *src)

{
  void *pvVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  
  *(undefined ***)dst = &PTR__alert_004ebb50;
  *(undefined8 *)(dst + 8) = *(undefined8 *)(src + 8);
  *(undefined ***)dst = &PTR__dht_stats_alert_004ed060;
  *(undefined8 *)(dst + 0x10) = *(undefined8 *)(src + 0x10);
  *(undefined8 *)(dst + 0x18) = *(undefined8 *)(src + 0x18);
  *(undefined8 *)(dst + 0x20) = *(undefined8 *)(src + 0x20);
  src[0x20] = '\0';
  src[0x21] = '\0';
  src[0x22] = '\0';
  src[0x23] = '\0';
  src[0x24] = '\0';
  src[0x25] = '\0';
  src[0x26] = '\0';
  src[0x27] = '\0';
  src[0x10] = '\0';
  src[0x11] = '\0';
  src[0x12] = '\0';
  src[0x13] = '\0';
  src[0x14] = '\0';
  src[0x15] = '\0';
  src[0x16] = '\0';
  src[0x17] = '\0';
  src[0x18] = '\0';
  src[0x19] = '\0';
  src[0x1a] = '\0';
  src[0x1b] = '\0';
  src[0x1c] = '\0';
  src[0x1d] = '\0';
  src[0x1e] = '\0';
  src[0x1f] = '\0';
  *(undefined8 *)(dst + 0x28) = *(undefined8 *)(src + 0x28);
  *(undefined8 *)(dst + 0x30) = *(undefined8 *)(src + 0x30);
  *(undefined8 *)(dst + 0x38) = *(undefined8 *)(src + 0x38);
  src[0x38] = '\0';
  src[0x39] = '\0';
  src[0x3a] = '\0';
  src[0x3b] = '\0';
  src[0x3c] = '\0';
  src[0x3d] = '\0';
  src[0x3e] = '\0';
  src[0x3f] = '\0';
  src[0x28] = '\0';
  src[0x29] = '\0';
  src[0x2a] = '\0';
  src[0x2b] = '\0';
  src[0x2c] = '\0';
  src[0x2d] = '\0';
  src[0x2e] = '\0';
  src[0x2f] = '\0';
  src[0x30] = '\0';
  src[0x31] = '\0';
  src[0x32] = '\0';
  src[0x33] = '\0';
  src[0x34] = '\0';
  src[0x35] = '\0';
  src[0x36] = '\0';
  src[0x37] = '\0';
  *(undefined4 *)(dst + 0x50) = *(undefined4 *)(src + 0x50);
  uVar2 = *(undefined8 *)(src + 0x48);
  *(undefined8 *)(dst + 0x40) = *(undefined8 *)(src + 0x40);
  *(undefined8 *)(dst + 0x48) = uVar2;
  uVar2 = *(undefined8 *)(src + 0x54);
  uVar3 = *(undefined8 *)(src + 0x5c);
  uVar4 = *(undefined8 *)(src + 0x68);
  *(undefined8 *)(dst + 0x60) = *(undefined8 *)(src + 0x60);
  *(undefined8 *)(dst + 0x68) = uVar4;
  *(undefined8 *)(dst + 0x54) = uVar2;
  *(undefined8 *)(dst + 0x5c) = uVar3;
  pvVar1 = *(void **)(src + 0x28);
  if (pvVar1 != (void *)0x0) {
    operator_delete(pvVar1,*(long *)(src + 0x38) - (long)pvVar1);
  }
  pvVar1 = *(void **)(src + 0x10);
  if (pvVar1 != (void *)0x0) {
    operator_delete(pvVar1,*(long *)(src + 0x20) - (long)pvVar1);
  }
  alert::~alert((alert *)src);
  return;
}

Assistant:

static void move(char* dst, char* src) noexcept
		{
			static_assert(std::is_nothrow_move_constructible<U>::value
				, "heterogeneous queue only supports noexcept move constructible types");
			static_assert(std::is_nothrow_destructible<U>::value
				, "heterogeneous queue only supports noexcept destructible types");
			U& rhs = *reinterpret_cast<U*>(src);

			TORRENT_ASSERT((reinterpret_cast<std::uintptr_t>(dst) & (alignof(U) - 1)) == 0);

			new (dst) U(std::move(rhs));
			rhs.~U();
		}